

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_icu.cpp
# Opt level: O1

QString * __thiscall
QLocalePrivate::toUpper(QString *__return_storage_ptr__,QLocalePrivate *this,QString *str,bool *ok)

{
  bool bVar1;
  long in_FS_OFFSET;
  QByteArray local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  bcp47Name(&local_38,this,'_');
  if (local_38.d.ptr == (char *)0x0) {
    local_38.d.ptr = "";
  }
  bVar1 = qt_u_strToCase(str,__return_storage_ptr__,local_38.d.ptr,u_strToUpper_70);
  *ok = bVar1;
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocalePrivate::toUpper(const QString &str, bool *ok) const
{
    Q_ASSERT(ok);
    QString out;
    *ok = qt_u_strToCase(str, &out, bcp47Name('_'), u_strToUpper);
    return out;
}